

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsEval.c
# Opt level: O3

void UnaryExpression_predec_eval(JsAstNode *na,JsContext *context,JsValue *res)

{
  JsValue *res_00;
  undefined1 local_68 [8];
  JsValue r1;
  JsValue r2;
  JsValue v0;
  
  (*JsNodeClassEval[(*(JsAstNode **)(na + 1))->astClass])
            (*(JsAstNode **)(na + 1),context,(JsValue *)local_68);
  res_00 = (JsValue *)((long)&r1.u + 8);
  JsGetValue((JsValue *)local_68,res_00);
  JsToNumber(res_00,res);
  (res->u).number = (res->u).number + -1.0;
  JsPutValue((JsValue *)local_68,res,(JsValue *)((long)&r2.u + 8));
  return;
}

Assistant:

static void
UnaryExpression_predec_eval(na, context, res)
	struct JsAstNode *na; /* (struct JsAstUnaryNode) */
	struct JsContext *context;
	struct JsValue *res;
{
	struct JsAstUnaryNode *n = CAST_NODE(na, JsAstUnaryNode);
	struct JsValue r1, r2,v0;

	EVAL(n->a, context, &r1);
	JsGetValue( &r1, &r2);
	JsToNumber( &r2, res);
	res->u.number--;
	JsPutValue( &r1, res,&v0);
}